

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void attr_merge_lists(attr_list list1,attr_list list2)

{
  attr_union value;
  undefined4 length;
  int iVar1;
  char *pcVar2;
  size_t __size;
  int index;
  attr attr_guy;
  atom_t local_58;
  attr_value_type local_54;
  anon_union_16_6_0081cd67_for_u local_50;
  attr_list local_40;
  int local_34;
  
  local_40 = list1;
  iVar1 = attr_count(list2);
  index = 0;
  local_34 = iVar1;
  if (iVar1 < 1) {
    iVar1 = index;
    local_34 = index;
  }
  for (; iVar1 != index; index = index + 1) {
    get_pattr(list2,index,&local_58,&local_54,(attr_union *)&local_50.o);
    length = local_50.f;
    if (local_54 == Attr_Opaque) {
      __size = (size_t)local_50.i;
      pcVar2 = (char *)malloc(__size);
      memcpy(pcVar2,local_50.o.buffer,__size);
      iVar1 = local_34;
      set_opaque_attr(local_40,local_58,length,pcVar2);
    }
    else if (local_54 == Attr_String) {
      pcVar2 = strdup((char *)CONCAT44(local_50.l._4_4_,local_50.i));
      set_string_attr(local_40,local_58,pcVar2);
    }
    else {
      value.u.l._4_4_ = local_50.l._4_4_;
      value.u.i = local_50.i;
      value.u.o.buffer = local_50.o.buffer;
      set_pattr(local_40,local_58,local_54,value);
    }
  }
  return;
}

Assistant:

extern void
attr_merge_lists(attr_list list1, attr_list list2)
{
    attr attr_guy;
    int i;
    int c = attr_count(list2);
    /* need to make this more efficient */

    for (i = 0; i < c; i++) {
	get_pattr(list2, i, &attr_guy.attr_id, &attr_guy.val_type,
		  &attr_guy.value);
	if (attr_guy.val_type == Attr_String) {
	    char *s = strdup((char *) attr_guy.value.u.p);
	    set_string_attr(list1, attr_guy.attr_id, s);
        } else if (attr_guy.val_type == Attr_Opaque) {
            char *b = malloc(attr_guy.value.u.o.length);
            memcpy(b, attr_guy.value.u.o.buffer, attr_guy.value.u.o.length);
	    set_opaque_attr(list1, attr_guy.attr_id, attr_guy.value.u.o.length, b);
	} else {
	    set_pattr(list1, attr_guy.attr_id, attr_guy.val_type, attr_guy.value);
	}
    }
}